

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlStringLenGetNodeList(xmlDoc *doc,xmlChar *value,int len)

{
  int iVar1;
  byte *pbVar2;
  xmlBufPtr buf_00;
  xmlEntityPtr pxVar3;
  xmlChar *pxVar4;
  xmlNodePtr pxVar5;
  xmlChar *pxVar6;
  xmlNodePtr pxVar7;
  bool bVar8;
  xmlChar local_8a [2];
  int l;
  xmlChar buffer [10];
  xmlNodePtr temp;
  xmlChar tmp;
  int charval;
  xmlBufPtr buf;
  xmlEntityPtr ent;
  xmlChar *q;
  xmlChar *end;
  xmlChar *cur;
  xmlChar *val;
  xmlNodePtr node;
  xmlNodePtr last;
  xmlNodePtr ret;
  int len_local;
  xmlChar *value_local;
  xmlDoc *doc_local;
  
  last = (xmlNodePtr)0x0;
  node = (xmlNodePtr)0x0;
  if (value == (xmlChar *)0x0) {
    doc_local = (xmlDoc *)0x0;
  }
  else {
    pbVar2 = value + len;
    buf_00 = xmlBufCreateSize(0);
    if (buf_00 == (xmlBufPtr)0x0) {
      doc_local = (xmlDoc *)0x0;
    }
    else {
      xmlBufSetAllocationScheme(buf_00,XML_BUFFER_ALLOC_DOUBLEIT);
      ent = (xmlEntityPtr)value;
      end = value;
      do {
        do {
          while( true ) {
            bVar8 = false;
            if (end < pbVar2) {
              bVar8 = *end != '\0';
            }
            pxVar7 = last;
            if (!bVar8) {
              if (((xmlEntityPtr)end == ent) ||
                 (iVar1 = xmlBufAdd(buf_00,(xmlChar *)ent,(int)end - (int)ent), iVar1 == 0)) {
                iVar1 = xmlBufIsEmpty(buf_00);
                if (iVar1 == 0) {
                  pxVar5 = xmlNewDocText(doc,(xmlChar *)0x0);
                  if (pxVar5 != (xmlNodePtr)0x0) {
                    pxVar6 = xmlBufDetach(buf_00);
                    pxVar5->content = pxVar6;
                    pxVar7 = pxVar5;
                    if (node != (xmlNodePtr)0x0) {
                      xmlAddNextSibling(node,pxVar5);
                      pxVar7 = last;
                    }
                  }
                }
                else if (last == (xmlNodePtr)0x0) {
                  pxVar7 = xmlNewDocText(doc,"");
                }
              }
              goto LAB_001b961a;
            }
            if (*end == '&') break;
            end = end + 1;
          }
          temp._4_4_ = 0;
          if (((xmlEntityPtr)end != ent) &&
             (iVar1 = xmlBufAdd(buf_00,(xmlChar *)ent,(int)end - (int)ent), iVar1 != 0))
          goto LAB_001b961a;
          if ((end + 2 < pbVar2) && ((end[1] == '#' && (end[2] == 'x')))) {
            end = end + 3;
            if (end < pbVar2) {
              temp._3_1_ = *end;
            }
            else {
              temp._3_1_ = 0;
            }
            while (temp._3_1_ != 0x3b) {
              if ((temp._3_1_ < 0x30) || (0x39 < temp._3_1_)) {
                if ((temp._3_1_ < 0x61) || (0x66 < temp._3_1_)) {
                  if ((temp._3_1_ < 0x41) || (0x46 < temp._3_1_)) {
                    xmlTreeErr(0x514,(xmlNodePtr)doc,(char *)0x0);
                    temp._4_4_ = 0;
                    break;
                  }
                  temp._4_4_ = temp._4_4_ * 0x10 + (uint)temp._3_1_ + -0x37;
                }
                else {
                  temp._4_4_ = temp._4_4_ * 0x10 + (uint)temp._3_1_ + -0x57;
                }
              }
              else {
                temp._4_4_ = temp._4_4_ * 0x10 + (temp._3_1_ - 0x30);
              }
              end = end + 1;
              if (end < pbVar2) {
                temp._3_1_ = *end;
              }
              else {
                temp._3_1_ = 0;
              }
            }
            if (temp._3_1_ == 0x3b) {
              end = end + 1;
            }
          }
          else if ((end + 1 < pbVar2) && (end[1] == '#')) {
            end = end + 2;
            if (end < pbVar2) {
              temp._3_1_ = *end;
            }
            else {
              temp._3_1_ = 0;
            }
            while (temp._3_1_ != 0x3b) {
              if ((temp._3_1_ < 0x30) || (0x39 < temp._3_1_)) {
                xmlTreeErr(0x515,(xmlNodePtr)doc,(char *)0x0);
                temp._4_4_ = 0;
                break;
              }
              temp._4_4_ = temp._4_4_ * 10 + (temp._3_1_ - 0x30);
              end = end + 1;
              if (end < pbVar2) {
                temp._3_1_ = *end;
              }
              else {
                temp._3_1_ = 0;
              }
            }
            if (temp._3_1_ == 0x3b) {
              end = end + 1;
            }
          }
          else {
            pxVar6 = end + 1;
            end = pxVar6;
            while( true ) {
              bVar8 = false;
              if ((end < pbVar2) && (bVar8 = false, *end != '\0')) {
                bVar8 = *end != ';';
              }
              if (!bVar8) break;
              end = end + 1;
            }
            if ((pbVar2 <= end) || (*end == '\0')) {
              xmlTreeErr(0x516,(xmlNodePtr)doc,(char *)pxVar6);
              goto LAB_001b961a;
            }
            if (end != pxVar6) {
              pxVar6 = xmlStrndup(pxVar6,(int)end - (int)pxVar6);
              pxVar3 = xmlGetDocEntity(doc,pxVar6);
              if ((pxVar3 == (xmlEntityPtr)0x0) || (pxVar3->etype != XML_INTERNAL_PREDEFINED_ENTITY)
                 ) {
                iVar1 = xmlBufIsEmpty(buf_00);
                pxVar5 = node;
                if (iVar1 == 0) {
                  pxVar5 = xmlNewDocText(doc,(xmlChar *)0x0);
                  if (pxVar5 == (xmlNodePtr)0x0) {
                    if (pxVar6 != (xmlChar *)0x0) {
                      (*xmlFree)(pxVar6);
                    }
                    goto LAB_001b961a;
                  }
                  pxVar4 = xmlBufDetach(buf_00);
                  pxVar5->content = pxVar4;
                  pxVar7 = pxVar5;
                  if (node != (xmlNodePtr)0x0) {
                    pxVar5 = xmlAddNextSibling(node,pxVar5);
                    pxVar7 = last;
                  }
                }
                last = pxVar7;
                node = pxVar5;
                pxVar5 = xmlNewReference(doc,pxVar6);
                if (pxVar5 == (xmlNodePtr)0x0) {
                  pxVar7 = last;
                  if (pxVar6 != (xmlChar *)0x0) {
                    (*xmlFree)(pxVar6);
                  }
                  goto LAB_001b961a;
                }
                if ((pxVar3 != (xmlEntityPtr)0x0) && (pxVar3->children == (_xmlNode *)0x0)) {
                  pxVar3->children = (_xmlNode *)0xffffffffffffffff;
                  pxVar7 = xmlStringGetNodeList(doc,pxVar5->content);
                  pxVar3->children = pxVar7;
                  pxVar3->owner = 1;
                  for (buffer._2_8_ = pxVar3->children; buffer._2_8_ != 0;
                      buffer._2_8_ = *(undefined8 *)(buffer._2_8_ + 0x30)) {
                    *(xmlEntityPtr *)(buffer._2_8_ + 0x28) = pxVar3;
                    pxVar3->last = (_xmlNode *)buffer._2_8_;
                  }
                }
                pxVar7 = pxVar5;
                if (node != (xmlNodePtr)0x0) {
                  pxVar5 = xmlAddNextSibling(node,pxVar5);
                  pxVar7 = last;
                }
              }
              else {
                iVar1 = xmlBufCat(buf_00,pxVar3->content);
                pxVar5 = node;
                if (iVar1 != 0) goto LAB_001b961a;
              }
              last = pxVar7;
              node = pxVar5;
              (*xmlFree)(pxVar6);
            }
            end = end + 1;
          }
          ent = (xmlEntityPtr)end;
        } while (temp._4_4_ == 0);
        iVar1 = xmlCopyCharMultiByte(local_8a,temp._4_4_);
        local_8a[iVar1] = '\0';
        iVar1 = xmlBufCat(buf_00,local_8a);
        pxVar7 = last;
      } while (iVar1 == 0);
LAB_001b961a:
      last = pxVar7;
      xmlBufFree(buf_00);
      doc_local = (xmlDoc *)last;
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlStringLenGetNodeList(const xmlDoc *doc, const xmlChar *value, int len) {
    xmlNodePtr ret = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val;
    const xmlChar *cur, *end;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;

    if (value == NULL) return(NULL);
    cur = value;
    end = cur + len;

    buf = xmlBufCreateSize(0);
    if (buf == NULL) return(NULL);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

    q = cur;
    while ((cur < end) && (*cur != 0)) {
	if (cur[0] == '&') {
	    int charval = 0;
	    xmlChar tmp;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	    }
	    q = cur;
	    if ((cur + 2 < end) && (cur[1] == '#') && (cur[2] == 'x')) {
		cur += 3;
		if (cur < end)
		    tmp = *cur;
		else
		    tmp = 0;
		while (tmp != ';') { /* Non input consuming loop */
                    /*
                     * If you find an integer overflow here when fuzzing,
                     * the bug is probably elsewhere. This function should
                     * only receive entities that were already validated by
                     * the parser, typically by xmlParseAttValueComplex
                     * calling xmlStringDecodeEntities.
                     *
                     * So it's better *not* to check for overflow to
                     * potentially discover new bugs.
                     */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			xmlTreeErr(XML_TREE_INVALID_HEX, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    if (cur < end)
			tmp = *cur;
		    else
			tmp = 0;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else if ((cur + 1 < end) && (cur[1] == '#')) {
		cur += 2;
		if (cur < end)
		    tmp = *cur;
		else
		    tmp = 0;
		while (tmp != ';') { /* Non input consuming loops */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			xmlTreeErr(XML_TREE_INVALID_DEC, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    if (cur < end)
			tmp = *cur;
		    else
			tmp = 0;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
		q = cur;
		while ((cur < end) && (*cur != 0) && (*cur != ';')) cur++;
		if ((cur >= end) || (*cur == 0)) {
		    xmlTreeErr(XML_TREE_UNTERMINATED_ENTITY, (xmlNodePtr) doc,
		               (const char *) q);
		    goto out;
		}
		if (cur != q) {
		    /*
		     * Predefined entities don't generate nodes
		     */
		    val = xmlStrndup(q, cur - q);
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {

			if (xmlBufCat(buf, ent->content))
			    goto out;

		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
			    if (node == NULL) {
				if (val != NULL) xmlFree(val);
				goto out;
			    }
			    node->content = xmlBufDetach(buf);

			    if (last == NULL) {
				last = ret = node;
			    } else {
				last = xmlAddNextSibling(last, node);
			    }
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewReference(doc, val);
			if (node == NULL) {
			    if (val != NULL) xmlFree(val);
			    goto out;
			}
			else if ((ent != NULL) && (ent->children == NULL)) {
			    xmlNodePtr temp;

                            /* Set to non-NULL value to avoid recursion. */
			    ent->children = (xmlNodePtr) -1;
			    ent->children = xmlStringGetNodeList(doc,
				    (const xmlChar*)node->content);
			    ent->owner = 1;
			    temp = ent->children;
			    while (temp) {
				temp->parent = (xmlNodePtr)ent;
				ent->last = temp;
				temp = temp->next;
			    }
			}
			if (last == NULL) {
			    last = ret = node;
			} else {
			    last = xmlAddNextSibling(last, node);
			}
		    }
		    xmlFree(val);
		}
		cur++;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int l;

		l = xmlCopyCharMultiByte(buffer, charval);
		buffer[l] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
		charval = 0;
	    }
	} else
	    cur++;
    }

    if (cur != q) {
        /*
	 * Handle the last piece of text.
	 */
	if (xmlBufAdd(buf, q, cur - q))
	    goto out;
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
	if (node == NULL) goto out;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    ret = node;
	} else {
	    xmlAddNextSibling(last, node);
	}
    } else if (ret == NULL) {
        ret = xmlNewDocText(doc, BAD_CAST "");
    }

out:
    xmlBufFree(buf);
    return(ret);
}